

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

void netaddr_truncate(netaddr *dst,netaddr *src)

{
  byte bVar1;
  uint local_1c;
  int bit_prefix;
  int byte_prefix;
  netaddr *src_local;
  netaddr *dst_local;
  
  local_1c = src->_prefix_len / 8;
  bVar1 = src->_prefix_len;
  if (src != dst) {
    dst->_prefix_len = src->_prefix_len;
    dst->_type = src->_type;
    memcpy(dst,src,(long)(int)local_1c);
  }
  if ((bVar1 & 7) != 0) {
    dst->_addr[(int)local_1c] = src->_addr[(int)local_1c] & netaddr_truncate::MASK[(int)(bVar1 & 7)]
    ;
    local_1c = local_1c + 1;
  }
  if (local_1c < 0x10) {
    memset(dst->_addr + (int)local_1c,0,(long)(int)(0x10 - local_1c));
  }
  return;
}

Assistant:

void
netaddr_truncate(struct netaddr *dst, const struct netaddr *src) {
  static uint8_t MASK[] = { 0, 0x80, 0xc0, 0xe0, 0xf0, 0xf8, 0xfc, 0xfe };
  int byte_prefix, bit_prefix;

  /* calulate byte/bit part of prefix */
  byte_prefix = src->_prefix_len / 8;
  bit_prefix = src->_prefix_len & 7;

  if (src != dst) {
    /* copy type and prefix length */
    dst->_prefix_len = src->_prefix_len;
    dst->_type = src->_type;

    /* copy constant octets */
    memcpy(dst->_addr, src->_addr, byte_prefix);
  }

  if (bit_prefix) {
    /* modify bitwise */
    dst->_addr[byte_prefix] = src->_addr[byte_prefix] & MASK[bit_prefix];
    byte_prefix++;
  }

  if (byte_prefix < 16) {
    /* zero rest of address */
    memset(&dst->_addr[byte_prefix], 0, 16 - byte_prefix);
  }
}